

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O1

int32_t getShortestSubtagLength(char *localeID)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar3 = strlen(localeID);
  uVar2 = (uint)uVar3;
  if (0 < (int)uVar2) {
    uVar4 = uVar2 & 0x7fffffff;
    uVar5 = 0;
    bVar1 = true;
    uVar6 = 0;
    do {
      if ((localeID[uVar5] == '-') || (localeID[uVar5] == '_')) {
        uVar7 = uVar3 & 0xffffffff;
        if ((int)uVar6 < (int)uVar3) {
          uVar7 = (ulong)uVar6;
        }
        uVar3 = uVar3 & 0xffffffff;
        if (uVar6 != 0) {
          uVar3 = uVar7;
        }
        bVar1 = true;
      }
      else {
        uVar6 = uVar6 + 1;
        if (bVar1) {
          uVar6 = 1;
        }
        bVar1 = false;
      }
      uVar2 = (uint)uVar3;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return uVar2;
}

Assistant:

static int32_t getShortestSubtagLength(const char *localeID) {
    int32_t localeIDLength = static_cast<int32_t>(uprv_strlen(localeID));
    int32_t length = localeIDLength;
    int32_t tmpLength = 0;
    int32_t i;
    UBool reset = TRUE;

    for (i = 0; i < localeIDLength; i++) {
        if (localeID[i] != '_' && localeID[i] != '-') {
            if (reset) {
                tmpLength = 0;
                reset = FALSE;
            }
            tmpLength++;
        } else {
            if (tmpLength != 0 && tmpLength < length) {
                length = tmpLength;
            }
            reset = TRUE;
        }
    }

    return length;
}